

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::
     are_equal<agge::tests::mocks::coords_pair<int>,2ul,std::vector<agge::tests::mocks::coords_pair<int>,std::allocator<agge::tests::mocks::coords_pair<int>>>>
               (coords_pair<int> (*expected) [2],
               vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
               *actual,LocationInfo *location)

{
  vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
  *pvVar1;
  vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
  *__first1;
  bool value;
  const_iterator cVar2;
  const_iterator __last;
  unsigned_long local_30 [2];
  LocationInfo *local_20;
  LocationInfo *location_local;
  vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
  *actual_local;
  coords_pair<int> (*expected_local) [2];
  
  local_30[1] = 2;
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = (vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
                  *)expected;
  cVar2 = std::
          vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
          ::begin(actual);
  __last = std::
           vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
           ::end((vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
                  *)location_local);
  local_30[0] = std::
                distance<__gnu_cxx::__normal_iterator<agge::tests::mocks::coords_pair<int>const*,std::vector<agge::tests::mocks::coords_pair<int>,std::allocator<agge::tests::mocks::coords_pair<int>>>>>
                          ((__normal_iterator<const_agge::tests::mocks::coords_pair<int>_*,_std::vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>_>
                            )cVar2._M_current,
                           (__normal_iterator<const_agge::tests::mocks::coords_pair<int>_*,_std::vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>_>
                            )__last._M_current);
  are_equal<unsigned_long,unsigned_long>(local_30 + 1,local_30,local_20);
  __first1 = actual_local;
  pvVar1 = actual_local + 1;
  cVar2 = std::
          vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
          ::begin((vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
                   *)location_local);
  value = std::
          equal<agge::tests::mocks::coords_pair<int>*,__gnu_cxx::__normal_iterator<agge::tests::mocks::coords_pair<int>const*,std::vector<agge::tests::mocks::coords_pair<int>,std::allocator<agge::tests::mocks::coords_pair<int>>>>>
                    ((coords_pair<int> *)__first1,
                     (coords_pair<int> *)
                     &(pvVar1->
                      super__Vector_base<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<const_agge::tests::mocks::coords_pair<int>_*,_std::vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>_>
                      )cVar2._M_current);
  is_true(value,local_20);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}